

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_bonsai_nlm.hpp
# Opt level: O0

void __thiscall
poplar::plain_bonsai_nlm<int>::show_stats(plain_bonsai_nlm<int> *this,ostream *os,int n)

{
  string *indent_00;
  plain_bonsai_nlm<int> *in_RSI;
  plain_bonsai_nlm<int> *in_RDI;
  string indent;
  char (*in_stack_ffffffffffffff68) [17];
  char *in_stack_ffffffffffffff70;
  plain_bonsai_nlm<int> *this_00;
  string *in_stack_ffffffffffffff78;
  ostream *in_stack_ffffffffffffff80;
  plain_bonsai_nlm<int> *os_00;
  string local_38 [40];
  plain_bonsai_nlm<int> *local_10;
  
  local_10 = in_RSI;
  get_indent_abi_cxx11_((int)((ulong)local_38 >> 0x20));
  show_stat<char[17]>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                      in_stack_ffffffffffffff68);
  os_00 = local_10;
  size(in_RDI);
  show_stat<unsigned_long>
            ((ostream *)os_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (unsigned_long *)in_stack_ffffffffffffff68);
  this_00 = local_10;
  indent_00 = (string *)num_ptrs((plain_bonsai_nlm<int> *)0x20211f);
  show_stat<unsigned_long>
            ((ostream *)os_00,indent_00,(char *)this_00,(unsigned_long *)in_stack_ffffffffffffff68);
  alloc_bytes(this_00);
  show_stat<unsigned_long>((ostream *)os_00,indent_00,(char *)this_00,(unsigned_long *)local_10);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void show_stats(std::ostream& os, int n = 0) const {
        auto indent = get_indent(n);
        show_stat(os, indent, "name", "plain_bonsai_nlm");
        show_stat(os, indent, "size", size());
        show_stat(os, indent, "num_ptrs", num_ptrs());
        show_stat(os, indent, "alloc_bytes", alloc_bytes());
#ifdef POPLAR_EXTRA_STATS
        show_stat(os, indent, "max_length", max_length_);
        show_stat(os, indent, "ave_length", double(sum_length_) / size());
#endif
    }